

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

void Frc_ManPlacementRefine(Frc_Man_t *p,int nIters,int fVerbose)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Vec_Int_t *vCoOrder;
  int *pPerm;
  float *pArray;
  abctime aVar9;
  int *piVar10;
  abctime aVar11;
  long lVar12;
  size_t __size;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  int nCutCur2;
  uint local_5c;
  int local_58;
  uint local_54;
  long local_50;
  double local_48;
  abctime local_40;
  double local_38;
  
  local_58 = fVerbose;
  local_40 = Abc_Clock();
  vCoOrder = Frc_ManCollectCos(p);
  iVar5 = Frc_ManPlaceDfsBoth(p,vCoOrder,(int *)&local_5c);
  __size = (long)p->nObjs << 2;
  pPerm = (int *)malloc(__size);
  pArray = (float *)malloc(__size);
  local_48 = (double)iVar5;
  uVar8 = 0;
  if (nIters < 1) {
    nIters = 0;
  }
  local_50 = 0;
  local_54 = nIters;
  while( true ) {
    if (uVar8 == local_54) {
      free(pPerm);
      free(pArray);
      Vec_IntFree(vCoOrder);
      return;
    }
    local_38 = 0.0;
    iVar6 = 0;
    while ((iVar2 = p->nObjData, iVar6 < iVar2 && (p->pObjData != (int *)0x0))) {
      puVar1 = (uint *)(p->pObjData + iVar6);
      uVar7 = puVar1[1];
      uVar13 = puVar1[4];
      uVar15 = 0;
      if (0 < (int)uVar7) {
        uVar15 = uVar7;
      }
      uVar14 = uVar13;
      for (lVar17 = 0; uVar15 != (uint)lVar17; lVar17 = lVar17 + 1) {
        uVar3 = puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar17 + 6] + 4];
        if ((int)uVar3 <= (int)uVar13) {
          uVar13 = uVar3;
        }
        if ((int)uVar14 <= (int)uVar3) {
          uVar14 = uVar3;
        }
      }
      puVar1[5] = (uint)((float)(int)(uVar14 + uVar13) * 0.5);
      local_38 = local_38 + (double)(int)(uVar14 - uVar13);
      iVar6 = iVar6 + uVar7 + (*puVar1 >> 4) + 6;
    }
    lVar17 = 0;
    iVar6 = 0;
    while ((iVar6 < iVar2 && (p->pObjData != (int *)0x0))) {
      puVar1 = (uint *)(p->pObjData + iVar6);
      fVar18 = (float)puVar1[5];
      for (uVar16 = 0; *puVar1 >> 4 != uVar16; uVar16 = uVar16 + 1) {
        fVar18 = fVar18 + (float)puVar1[5 - (long)(int)puVar1[uVar16 + 6]];
      }
      pArray[lVar17] = fVar18 / (float)((*puVar1 >> 4) + 1);
      pPerm[lVar17] = iVar6;
      lVar17 = lVar17 + 1;
      iVar6 = puVar1[1] + (*puVar1 >> 4) + iVar6 + 6;
    }
    if (p->nObjs != (int)lVar17) break;
    aVar9 = Abc_Clock();
    piVar10 = Gia_SortFloats(pArray,pPerm,p->nObjs);
    aVar11 = Abc_Clock();
    if (piVar10 != pPerm) {
      __assert_fail("pPermX == pHandles",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                    ,0x3a8,"void Frc_ManPlacementRefine(Frc_Man_t *, int, int)");
    }
    local_50 = local_50 + (aVar11 - aVar9);
    vCoOrder->nSize = 0;
    for (lVar17 = 0; lVar17 < p->nObjs; lVar17 = lVar17 + 1) {
      lVar12 = (long)piVar10[lVar17];
      piVar4 = p->pObjData;
      piVar4[lVar12 + 4] = (int)lVar17;
      if ((*(byte *)(piVar4 + lVar12) & 2) != 0) {
        Vec_IntPush(vCoOrder,piVar4[lVar12 + 3]);
      }
    }
    uVar7 = Frc_ManPlaceDfsBoth(p,vCoOrder,(int *)&local_5c);
    uVar8 = uVar8 + 1;
    if (local_58 != 0) {
      printf("%2d : Span = %e  ",local_38,(ulong)uVar8);
      iVar6 = 0x828e82;
      printf("Cut = %6d  (%5.2f %%)  CutR = %6d  ",((double)(int)(iVar5 - uVar7) * 100.0) / local_48
             ,(ulong)uVar7,(ulong)local_5c);
      Abc_Print(iVar6,"%s =","Total");
      aVar9 = Abc_Clock();
      Abc_Print(iVar6,"%9.2f sec  ",(double)(aVar9 - local_40) / 1000000.0);
      Abc_Print(iVar6,"%s =","Sort");
      Abc_Print(iVar6,"%9.2f sec\n",(double)local_50 / 1000000.0);
    }
  }
  __assert_fail("Counter == Frc_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                ,0x3a3,"void Frc_ManPlacementRefine(Frc_Man_t *, int, int)");
}

Assistant:

void Frc_ManPlacementRefine( Frc_Man_t * p, int nIters, int fVerbose )
{
    int fRandomize = 0;
    Vec_Int_t * vCoOrder;
    Frc_Obj_t * pThis, * pNext;
    double CostThis, CostPrev;
    float * pVertX, VertX;
    int * pPermX, * pHandles;
    int k, h, Iter, iMinX, iMaxX, Counter, nCutStart, nCutCur, nCutCur2, nCutPrev;
    abctime clk = Abc_Clock(), clk2, clk2Total = 0;
    // create starting one-dimensional placement
    vCoOrder = Frc_ManCollectCos( p );
    if ( fRandomize )
        Frc_ManArrayShuffle( vCoOrder );
    nCutStart = Frc_ManPlaceDfsBoth( p, vCoOrder, &nCutCur2 );
    // refine placement
    CostPrev = 0.0;
    nCutPrev = nCutStart;
    pHandles = ABC_ALLOC( int, p->nObjs );
    pVertX   = ABC_ALLOC( float, p->nObjs );
    for ( Iter = 0; Iter < nIters; Iter++ )
    {
        // compute centers of hyperedges
        CostThis = 0.0;
        Frc_ManForEachObj( p, pThis, h )
        {
            iMinX = iMaxX = pThis->pPlace;
            Frc_ObjForEachFanout( pThis, pNext, k )
            {
                iMinX = Abc_MinInt( iMinX, pNext->pPlace );
                iMaxX = Abc_MaxInt( iMaxX, pNext->pPlace );
            }
            pThis->fEdgeCenter = 0.5 * (iMaxX + iMinX);
            CostThis += (iMaxX - iMinX);
        }
        // compute new centers of objects
        Counter = 0;
        Frc_ManForEachObj( p, pThis, h )
        {
            VertX = pThis->fEdgeCenter;
            Frc_ObjForEachFanin( pThis, pNext, k )
                VertX += pNext->fEdgeCenter;
            pVertX[Counter] = VertX / (Frc_ObjFaninNum(pThis) + 1);
            pHandles[Counter++] = h;
        }
        assert( Counter == Frc_ManObjNum(p) );
        // sort these numbers
        clk2 = Abc_Clock();
        pPermX = Gia_SortFloats( pVertX, pHandles, p->nObjs );
        clk2Total += Abc_Clock() - clk2;
        assert( pPermX == pHandles );
        Vec_IntClear( vCoOrder );
        for ( k = 0; k < p->nObjs; k++ )
        {
            pThis = Frc_ManObj( p, pPermX[k] );
            pThis->pPlace = k;
            if ( Frc_ObjIsCo(pThis) )
                Vec_IntPush( vCoOrder, pThis->hHandle );
        }
/*
        printf( "Ordering of PIs:\n" );
        Frc_ManForEachCi( p, pThis, k )
            printf( "PI number = %7d.  Object handle = %7d,  Coordinate = %7d.\n", 
                k, pThis->hHandle, pThis->pPlace );
*/
        nCutCur = Frc_ManPlaceDfsBoth( p, vCoOrder, &nCutCur2 );
        // evaluate cost
        if ( fVerbose )
        {
            printf( "%2d : Span = %e  ", Iter+1, CostThis );
            printf( "Cut = %6d  (%5.2f %%)  CutR = %6d  ", nCutCur, 100.0*(nCutStart-nCutCur)/nCutStart, nCutCur2 );
            ABC_PRTn( "Total", Abc_Clock() - clk );
            ABC_PRT( "Sort", clk2Total );
//        Frc_ManCrossCutTest( p, vCoOrder );
        }
//        if ( 1.0 * nCutPrev / nCutCur < 1.001 )
//            break;
        nCutPrev = nCutCur;
    }
    ABC_FREE( pHandles );
    ABC_FREE( pVertX );
    Vec_IntFree( vCoOrder );
}